

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Reader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::BP3Reader::InitBuffer(BP3Reader *this)

{
  undefined8 *puVar1;
  BP3Deserializer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  char cVar8;
  size_t sVar9;
  long *plVar10;
  undefined8 *puVar11;
  size_t sVar12;
  ulong *puVar13;
  ulong uVar14;
  size_type *psVar15;
  BP3Reader *engine;
  char cVar16;
  undefined8 uVar17;
  ulong uVar18;
  ulong __val;
  string err;
  string __str;
  string __str_1;
  string local_1a8;
  string local_188;
  string local_168;
  ulong *local_148;
  uint local_140;
  undefined4 uStack_13c;
  ulong local_138 [2];
  size_t local_128;
  TransportMan *local_120;
  ulong *local_118;
  uint local_110;
  undefined4 uStack_10c;
  ulong local_108 [2];
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  undefined8 *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  string local_b8;
  BP3Reader *local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->m_BP3Deserializer;
  engine = this;
  if (*(int *)((long)&(this->m_BP3Deserializer).m_Minifooter.VersionTag._M_string_length +
              *(long *)(*(long *)&this->m_BP3Deserializer + -0x18)) != 0) goto LAB_0042ceb5;
  local_120 = &this->m_FileManager;
  sVar9 = transportman::TransportMan::GetFileSize(local_120,0);
  uVar5 = *(uint *)(&(this->m_BP3Deserializer).field_0x198 +
                   *(long *)(*(long *)&this->m_BP3Deserializer + -0x18));
  __val = (ulong)uVar5;
  local_128 = sVar9;
  if (sVar9 < __val) {
    std::operator+(&local_50,"The size of the input file ",&(this->super_Engine).m_Name);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar13 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar13) {
      local_e8 = *puVar13;
      lStack_e0 = plVar10[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar13;
      local_f8 = (ulong *)*plVar10;
    }
    local_f0 = plVar10[1];
    *plVar10 = (long)puVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    cVar16 = '\x01';
    if (9 < sVar9) {
      sVar12 = sVar9;
      cVar8 = '\x04';
      do {
        cVar16 = cVar8;
        if (sVar12 < 100) {
          cVar16 = cVar16 + -2;
          goto LAB_0042c838;
        }
        if (sVar12 < 1000) {
          cVar16 = cVar16 + -1;
          goto LAB_0042c838;
        }
        if (sVar12 < 10000) goto LAB_0042c838;
        bVar7 = 99999 < sVar12;
        sVar12 = sVar12 / 10000;
        cVar8 = cVar16 + '\x04';
      } while (bVar7);
      cVar16 = cVar16 + '\x01';
    }
LAB_0042c838:
    local_148 = local_138;
    std::__cxx11::string::_M_construct((ulong)&local_148,cVar16);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_148,local_140,sVar9);
    uVar14 = CONCAT44(uStack_13c,local_140) + local_f0;
    uVar18 = 0xf;
    if (local_f8 != &local_e8) {
      uVar18 = local_e8;
    }
    if (uVar18 < uVar14) {
      uVar18 = 0xf;
      if (local_148 != local_138) {
        uVar18 = local_138[0];
      }
      if (uVar18 < uVar14) goto LAB_0042c8ac;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,(ulong)local_f8);
    }
    else {
LAB_0042c8ac:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_148);
    }
    local_d8 = &local_c8;
    puVar1 = puVar11 + 2;
    if ((undefined8 *)*puVar11 == puVar1) {
      local_c8 = *puVar1;
      uStack_c0 = puVar11[3];
    }
    else {
      local_c8 = *puVar1;
      local_d8 = (undefined8 *)*puVar11;
    }
    local_d0 = puVar11[1];
    *puVar11 = puVar1;
    puVar11[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_d8);
    paVar2 = &local_168.field_2;
    puVar13 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_168.field_2._M_allocated_capacity = *puVar13;
      local_168.field_2._8_8_ = plVar10[3];
      local_168._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_168.field_2._M_allocated_capacity = *puVar13;
      local_168._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_168._M_string_length = plVar10[1];
    *plVar10 = (long)puVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    cVar16 = '\x01';
    if (9 < uVar5) {
      uVar14 = __val;
      cVar8 = '\x04';
      do {
        cVar16 = cVar8;
        if (uVar14 < 100) {
          cVar16 = cVar16 + -2;
          goto LAB_0042c9d5;
        }
        if (uVar14 < 1000) {
          cVar16 = cVar16 + -1;
          goto LAB_0042c9d5;
        }
        if (uVar14 < 10000) goto LAB_0042c9d5;
        bVar7 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar8 = cVar16 + '\x04';
      } while (bVar7);
      cVar16 = cVar16 + '\x01';
    }
LAB_0042c9d5:
    local_118 = local_108;
    std::__cxx11::string::_M_construct((ulong)&local_118,cVar16);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_118,local_110,__val);
    uVar14 = CONCAT44(uStack_10c,local_110) + local_168._M_string_length;
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar2) {
      uVar17 = local_168.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < uVar14) {
      uVar18 = 0xf;
      if (local_118 != local_108) {
        uVar18 = local_108[0];
      }
      if (uVar18 < uVar14) goto LAB_0042ca4f;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_118,0,(char *)0x0,(ulong)local_168._M_dataplus._M_p);
    }
    else {
LAB_0042ca4f:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_118);
    }
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    psVar15 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_188.field_2._M_allocated_capacity = *psVar15;
      local_188.field_2._8_8_ = puVar11[3];
    }
    else {
      local_188.field_2._M_allocated_capacity = *psVar15;
      local_188._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_188._M_string_length = puVar11[1];
    *puVar11 = psVar15;
    puVar11[1] = 0;
    *(undefined1 *)psVar15 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_188);
    paVar4 = &local_b8.field_2;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_b8.field_2._M_allocated_capacity = *psVar15;
      local_b8.field_2._8_8_ = plVar10[3];
      local_b8._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar15;
      local_b8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_b8._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_1a8.field_2._M_allocated_capacity = *psVar15;
      local_1a8.field_2._8_8_ = plVar10[3];
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *psVar15;
      local_1a8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_1a8._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar4) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    paVar3 = &local_188.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar3) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if (local_118 != local_108) {
      operator_delete(local_118);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
    if (local_148 != local_138) {
      operator_delete(local_148);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Engine","");
    local_188._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"BP3Reader","");
    local_168._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Init","");
    helper::Throw<std::logic_error>(&local_b8,&local_188,&local_168,&local_1a8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar3) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar4) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    sVar9 = local_128;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8," fileSize < miniFooterSize, in call to Open","");
  local_98 = this;
  sVar9 = helper::GetDistance(sVar9,__val,&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  lVar6 = *(long *)(*(long *)this_00 + -0x18);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "allocating metadata buffer to inspect bp minifooter, in call to Open","");
  adios2::format::BufferSTL::Resize((BufferSTL *)(&this_00->field_0x88 + lVar6),__val,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  transportman::TransportMan::ReadFile
            (local_120,
             *(char **)(&(this->m_BP3Deserializer).field_0xc8 + *(long *)(*(long *)this_00 + -0x18))
             ,__val,sVar9,0);
  sVar9 = adios2::format::BP3Deserializer::MetadataStart
                    (this_00,(BufferSTL *)
                             (&this_00->field_0x88 + *(long *)(*(long *)this_00 + -0x18)));
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8," fileSize < miniFooterSize, in call to Open","");
  engine = local_98;
  sVar12 = helper::GetDistance(local_128,sVar9,&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  lVar6 = *(long *)(*(long *)this_00 + -0x18);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"allocating metadata buffer, in call to Open","");
  adios2::format::BufferSTL::Resize((BufferSTL *)(&this_00->field_0x88 + lVar6),sVar12,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  transportman::TransportMan::ReadFile
            (local_120,
             *(char **)(&(this->m_BP3Deserializer).field_0xc8 + *(long *)(*(long *)this_00 + -0x18))
             ,sVar12,sVar9,0);
LAB_0042ceb5:
  helper::Comm::BroadcastVector<char>
            (&(engine->super_Engine).m_Comm,
             (vector<char,_std::allocator<char>_> *)
             (&this_00->field_0xc8 +
             *(long *)(*(long *)&(engine->m_BP3Deserializer).field_0x0 + -0x18)),0);
  adios2::format::BP3Deserializer::ParseMetadata
            (this_00,(BufferSTL *)
                     (&this_00->field_0x88 +
                     *(long *)(*(long *)&(engine->m_BP3Deserializer).field_0x0 + -0x18)),
             &engine->super_Engine);
  IO::SetPrefixedNames((engine->super_Engine).m_IO,false);
  return;
}

Assistant:

void BP3Reader::InitBuffer()
{
    if (m_BP3Deserializer.m_RankMPI == 0)
    {
        const size_t fileSize = m_FileManager.GetFileSize();
        // handle single bp files from ADIOS 1.x by getting onl the metadata in
        // buffer

        // Load/Read Minifooter
        const size_t miniFooterSize = m_BP3Deserializer.m_MetadataSet.MiniFooterSize;
        if (fileSize < miniFooterSize)
        {
            std::string err = "The size of the input file " + m_Name + "(" +
                              std::to_string(fileSize) +
                              " bytes) is less than the minimum BP3 header "
                              "size, which is " +
                              std::to_string(miniFooterSize) + " bytes." +
                              " It is unlikely that this is a .bp file.";
            helper::Throw<std::logic_error>("Engine", "BP3Reader", "Init", err);
        }
        const size_t miniFooterStart = helper::GetDistance(
            fileSize, miniFooterSize, " fileSize < miniFooterSize, in call to Open");

        m_BP3Deserializer.m_Metadata.Resize(
            miniFooterSize, "allocating metadata buffer to inspect bp minifooter, in call to "
                            "Open");

        m_FileManager.ReadFile(m_BP3Deserializer.m_Metadata.m_Buffer.data(), miniFooterSize,
                               miniFooterStart);

        // Load/Read Metadata
        const size_t metadataStart = m_BP3Deserializer.MetadataStart(m_BP3Deserializer.m_Metadata);
        const size_t metadataSize = helper::GetDistance(
            fileSize, metadataStart, " fileSize < miniFooterSize, in call to Open");

        m_BP3Deserializer.m_Metadata.Resize(metadataSize,
                                            "allocating metadata buffer, in call to Open");

        m_FileManager.ReadFile(m_BP3Deserializer.m_Metadata.m_Buffer.data(), metadataSize,
                               metadataStart);
    }

    // broadcast metadata buffer to all ranks from zero
    m_Comm.BroadcastVector(m_BP3Deserializer.m_Metadata.m_Buffer);

    // fills IO with available Variables and Attributes
    m_BP3Deserializer.ParseMetadata(m_BP3Deserializer.m_Metadata, *this);
    // caches attributes associated with variables
    m_IO.SetPrefixedNames(false);
}